

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

bool __thiscall WorkQueue<HTTPClosure>::Enqueue(WorkQueue<HTTPClosure> *this,HTTPClosure *item)

{
  _Map_pointer ppuVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  _Head_base<0UL,_HTTPClosure_*,_false> local_30;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  if ((this->running == true) &&
     (ppuVar1 = (this->queue).
                super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
     ((long)(this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last -
      (long)(this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
     ((long)(this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
      (long)(this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
     ((((ulong)((long)ppuVar1 -
               (long)(this->queue).
                     super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
     (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40 < this->maxDepth)) {
    local_30._M_head_impl = item;
    std::
    deque<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>,std::allocator<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>>
    ::emplace_back<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>
              ((deque<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>,std::allocator<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>>
                *)&this->queue,
               (unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)&local_30);
    if (local_30._M_head_impl != (HTTPClosure *)0x0) {
      (*(local_30._M_head_impl)->_vptr_HTTPClosure[2])();
    }
    std::condition_variable::notify_one();
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        LOCK(cs);
        if (!running || queue.size() >= maxDepth) {
            return false;
        }
        queue.emplace_back(std::unique_ptr<WorkItem>(item));
        cond.notify_one();
        return true;
    }